

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

Ref<Lodtalk::MethodASTHandle> * __thiscall Lodtalk::AST::MethodAST::getHandle(MethodAST *this)

{
  MethodASTHandle *pMVar1;
  
  if ((this->astHandle).reference.oop.field_0.pointer == (uint8_t *)&NilObject) {
    pMVar1 = MethodASTHandle::basicNativeNew(this->context,this);
    (this->astHandle).reference.oop.field_0.header = (ObjectHeader *)pMVar1;
  }
  return &this->astHandle;
}

Assistant:

const Ref<MethodASTHandle> &MethodAST::getHandle()
{
	if(astHandle.isNil())
		astHandle.reset(MethodASTHandle::basicNativeNew(context, this));

	return astHandle;
}